

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Vector3f *
phyr::uniformSampleCone
          (Vector3f *__return_storage_ptr__,Point2f *u,double cosThetaMax,Vector3f *x,Vector3f *y,
          Vector3f *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = (1.0 - u->x) * cosThetaMax + u->x;
  dVar6 = 1.0 - dVar10 * dVar10;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = (u->y + u->y) * 3.141592653589793;
  dVar8 = cos(dVar7);
  dVar8 = dVar8 * dVar6;
  dVar1 = x->z;
  dVar2 = x->x;
  dVar3 = x->y;
  dVar9 = sin(dVar7);
  dVar9 = dVar9 * dVar6;
  dVar4 = y->y;
  dVar6 = y->z;
  dVar5 = z->y;
  dVar7 = z->z;
  __return_storage_ptr__->x = dVar10 * z->x + dVar9 * y->x + dVar8 * dVar2;
  __return_storage_ptr__->y = dVar10 * dVar5 + dVar9 * dVar4 + dVar8 * dVar3;
  __return_storage_ptr__->z = dVar10 * dVar7 + dVar9 * dVar6 + dVar1 * dVar8;
  return __return_storage_ptr__;
}

Assistant:

Vector3f uniformSampleCone(const Point2f& u, Real cosThetaMax,
                           const Vector3f& x, const Vector3f& y,
                           const Vector3f& z) {
    Real cosTheta = lerp(u[0], cosThetaMax, 1.f);
    Real sinTheta = std::sqrt((Real)1. - cosTheta * cosTheta);
    Real phi = u[1] * 2 * Pi;
    return std::cos(phi) * sinTheta * x + std::sin(phi) * sinTheta * y + cosTheta * z;
}